

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O1

void envy_bios_print_dcb(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_dcb_entry *peVar1;
  byte bVar2;
  ushort uVar3;
  envy_bios_dcb_entry *peVar4;
  envy_bios_conn_entry *peVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  uVar3 = (bios->dcb).offset;
  if ((mask >> 0x10 & 1) != 0 && uVar3 != 0) {
    bVar2 = (bios->dcb).version;
    uVar9 = (ulong)(bVar2 >> 4);
    uVar8 = (ulong)(bVar2 & 0xf);
    if ((bios->dcb).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse DCB table at 0x%04x version %d.%d\n\n",(ulong)uVar3,uVar9
              ,uVar8);
      return;
    }
    fprintf((FILE *)out,"DCB table at 0x%04x version %d.%d",(ulong)uVar3,uVar9,uVar8);
    if (0x2f < (bios->dcb).version) {
      fprintf((FILE *)out," unk16 0x%02x",(ulong)(bios->dcb).unk16);
    }
    fputc(10,(FILE *)out);
    envy_bios_dump_hex(bios,out,(uint)(bios->dcb).offset,(uint)(bios->dcb).hlen,mask);
    if ((bios->dcb).entriesnum != '\0') {
      uVar9 = 0;
      do {
        peVar4 = (bios->dcb).entries;
        peVar1 = peVar4 + uVar9;
        if (((mask >> 0x1e & 1) != 0) || (peVar4[uVar9].type != '\x0f')) {
          fprintf((FILE *)out,"DCB %d:",uVar9 & 0xffffffff);
          if (0x13 < (bios->dcb).version) {
            pcVar6 = find_enum(dcb_types,(uint)peVar1->type);
            pcVar7 = find_enum(dcb_lvds_info_types,(uint)peVar1->lvds_info);
            fprintf((FILE *)out," type %d [%s]",(ulong)peVar1->type,pcVar6);
            if ((peVar1->type & 0xfe) != 0xe) {
              if (peVar1->i2c != '\x0f') {
                fprintf((FILE *)out," I2C %d");
              }
              if (peVar1->heads != '\0') {
                fwrite(" heads",6,1,(FILE *)out);
                uVar11 = 0;
                do {
                  if ((peVar1->heads >> (uVar11 & 0x1f) & 1) != 0) {
                    fprintf((FILE *)out," %d",(ulong)uVar11);
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 != 4);
              }
              if (peVar1->unk00_4 != '\0') {
                fprintf((FILE *)out," unk00_4 %d");
              }
              if (((bios->dcb).version < 0x30) ||
                 (peVar5 = (bios->conn).entries, peVar5 == (envy_bios_conn_entry *)0x0)) {
                if (peVar1->unk01_4 != '\0') {
                  fprintf((FILE *)out," unk01_4 %d");
                }
              }
              else {
                fprintf((FILE *)out," CONN %d [0x%02x]",(ulong)peVar1->conn,
                        (ulong)peVar5[peVar1->conn].type);
              }
              fprintf((FILE *)out," conntag %d",(ulong)peVar1->conntag);
              bVar2 = peVar1->loc;
              if (bVar2 == 1) {
                bVar2 = peVar1->ext_addr;
                pcVar6 = " EXT %d";
LAB_002567e2:
                fprintf((FILE *)out,pcVar6,(ulong)bVar2);
              }
              else {
                if (bVar2 != 0) {
                  pcVar6 = " unk loc %d";
                  goto LAB_002567e2;
                }
                fwrite(" LOCAL",6,1,(FILE *)out);
              }
              if ((peVar1->ext_addr != '\0') && (peVar1->loc != '\x01')) {
                fprintf((FILE *)out," unk_ext_addr %d");
              }
              if (peVar1->unk02_6 != '\0') {
                fprintf((FILE *)out," unk02_6 %d");
              }
              if (peVar1->or != '\0') {
                fwrite(" OR",3,1,(FILE *)out);
                uVar11 = 0;
                do {
                  if ((peVar1->or >> (uVar11 & 0x1f) & 1) != 0) {
                    fprintf((FILE *)out," %d",(ulong)uVar11);
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 != 4);
              }
              if (peVar1->unk03_4 != '\0') {
                fprintf((FILE *)out," unk03_4 %d");
              }
              if (((peVar1->type < 7) && ((0x4cU >> (peVar1->type & 0x1f) & 1) != 0)) &&
                 (0x3f < (bios->dcb).version)) {
                fwrite(" links",6,1,(FILE *)out);
                uVar11 = 0;
                do {
                  if ((peVar1->links >> (uVar11 & 0x1f) & 1) != 0) {
                    fprintf((FILE *)out," %d",(ulong)uVar11);
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 == 1);
              }
              if (peVar1->maxfreq != 0) {
                fprintf((FILE *)out," maxfreq %dkHz");
              }
              if (peVar1->tmds_hdmi != '\0') {
                fwrite(" HDMI",5,1,(FILE *)out);
              }
              if (peVar1->type == '\x03') {
                fprintf((FILE *)out," INFO %s",pcVar7);
                fprintf((FILE *)out," POWER %d",(ulong)peVar1->lvds_pscript);
              }
              if (peVar1->type == '\x06') {
                if (peVar1->dp_bw == '\x01') {
                  pcVar6 = " BW 270000";
LAB_0025697e:
                  fwrite(pcVar6,10,1,(FILE *)out);
                }
                else {
                  if (peVar1->dp_bw == '\0') {
                    pcVar6 = " BW 162000";
                    goto LAB_0025697e;
                  }
                  fprintf((FILE *)out," BW UNK%d");
                }
                fwrite(" lanes",6,1,(FILE *)out);
                uVar11 = 0;
                do {
                  if ((peVar1->dp_lanes >> (uVar11 & 0x1f) & 1) != 0) {
                    fprintf((FILE *)out," %d",(ulong)uVar11);
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 != 4);
              }
              if (peVar1->unk04 != '\0') {
                fprintf((FILE *)out," unk04 0x%02x");
              }
              if (peVar1->unk05 != '\0') {
                fprintf((FILE *)out," unk05 0x%02x");
              }
              if (peVar1->unk06 != '\0') {
                fprintf((FILE *)out," unk06 0x%02x");
              }
              if (peVar1->unk07 != '\0') {
                fprintf((FILE *)out," unk07 0x%02x");
              }
            }
          }
          fputc(10,(FILE *)out);
        }
        envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->dcb).rlen,mask);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (bios->dcb).entriesnum);
    }
    fputc(10,(FILE *)out);
    if (bios->dev_rec_offset != 0) {
      fprintf((FILE *)out,"DEV_REC at 0x%04x\n");
      envy_bios_dump_hex(bios,out,bios->dev_rec_offset,7,mask);
      fputc(10,(FILE *)out);
    }
    if ((bios->dcb).rdcb_valid != '\0') {
      bVar2 = (bios->dcb).rdcb_version;
      fprintf((FILE *)out,"RDCB table at 0x%04x version %d.%d",(ulong)(bios->dcb).offset,
              (ulong)(bVar2 >> 4),(ulong)(bVar2 & 0xf));
      if ((bios->dcb).tvdac0_present != '\0') {
        fprintf((FILE *)out," TVDAC0 line %d",(ulong)(bios->dcb).tvdac0_line);
        if ((bios->dcb).tvdac0_neg != '\0') {
          fwrite(" NEG",4,1,(FILE *)out);
        }
      }
      if ((bios->dcb).rdcb_unk04_0 != '\0') {
        fprintf((FILE *)out," unk04_0 %d");
      }
      if ((bios->dcb).rdcb_unk05_2 != '\0') {
        fprintf((FILE *)out," unk05_2 %d");
      }
      lVar10 = 0x169;
      do {
        if (*(char *)((long)&bios->data + lVar10) != '\0') {
          fprintf((FILE *)out," unk0x%02x 0x%02x",(ulong)((int)lVar10 - 0x163));
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x170);
      if ((bios->dcb).rdcb_unk0d != '\0') {
        fprintf((FILE *)out," unk0d 0x%02x");
      }
      lVar10 = 0;
      do {
        if ((bios->dcb).rdcb_unk10[lVar10] != '\0') {
          fprintf((FILE *)out," unk0x%02x 0x%02x",(ulong)((uint)lVar10 | 0x10));
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0xd);
      fputc(10,(FILE *)out);
      uVar11 = (uint)(bios->dcb).rdcb_len;
      envy_bios_dump_hex(bios,out,(bios->dcb).offset - uVar11,uVar11,mask);
      fputc(10,(FILE *)out);
      return;
    }
  }
  return;
}

Assistant:

void envy_bios_print_dcb (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	if (!dcb->offset || !(mask & ENVY_BIOS_PRINT_DCB))
		return;
	if (!dcb->valid) {
		fprintf(out, "Failed to parse DCB table at 0x%04x version %d.%d\n\n", dcb->offset, dcb->version >> 4, dcb->version & 0xf);
		return;
	}
	fprintf(out, "DCB table at 0x%04x version %d.%d", dcb->offset, dcb->version >> 4, dcb->version & 0xf);
	if (dcb->version >= 0x30)
		fprintf(out, " unk16 0x%02x", dcb->unk16);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, dcb->offset, dcb->hlen, mask);
	int i;
	for (i = 0; i < dcb->entriesnum; i++) {
		struct envy_bios_dcb_entry *entry = &dcb->entries[i];
		if (entry->type != ENVY_BIOS_DCB_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			fprintf(out, "DCB %d:", i);
			if (dcb->version >= 0x14) {
				const char *typename = find_enum(dcb_types, entry->type);
				const char *lvdsinfo = find_enum(dcb_lvds_info_types, entry->lvds_info);
				fprintf(out, " type %d [%s]", entry->type, typename);
				if (entry->type != ENVY_BIOS_DCB_EOL && entry->type != ENVY_BIOS_DCB_UNUSED) {
					if (entry->i2c != 15)
						fprintf(out, " I2C %d", entry->i2c);
					int j;
					if (entry->heads) {
						fprintf(out, " heads");
						for (j = 0; j < 4; j++)
							if (entry->heads & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->unk00_4)
						fprintf(out, " unk00_4 %d", entry->unk00_4);
					if (dcb->version >= 0x30 && bios->conn.entries)
						fprintf(out, " CONN %d [0x%02x]", entry->conn, bios->conn.entries[entry->conn].type);
					else if (entry->unk01_4)
						fprintf(out, " unk01_4 %d", entry->unk01_4);
					fprintf(out, " conntag %d", entry->conntag);
					switch (entry->loc) {
						case 0:
							fprintf(out, " LOCAL");
							break;
						case 1:
							fprintf(out, " EXT %d", entry->ext_addr);
							break;
						default:
							fprintf(out, " unk loc %d", entry->loc);
							break;
					}
					if (entry->ext_addr && entry->loc != 1)
						fprintf(out, " unk_ext_addr %d", entry->ext_addr);
					if (entry->unk02_6)
						fprintf(out, " unk02_6 %d", entry->unk02_6);
					if (entry->or) {
						fprintf(out, " OR");
						for (j = 0; j < 4; j++)
							if (entry->or & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->unk03_4)
						fprintf(out, " unk03_4 %d", entry->unk03_4);
					if ((entry->type == ENVY_BIOS_DCB_LVDS || entry->type == ENVY_BIOS_DCB_TMDS || entry->type == ENVY_BIOS_DCB_DP) && dcb->version >= 0x40) {
						fprintf(out, " links");
						for (j = 0; j < 2; j++)
							if (entry->links & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->maxfreq)
						fprintf(out, " maxfreq %dkHz", entry->maxfreq);
					if (entry->tmds_hdmi)
						fprintf(out, " HDMI");
					if (entry->type == ENVY_BIOS_DCB_LVDS) {
						fprintf(out, " INFO %s", lvdsinfo);
						fprintf(out, " POWER %d", entry->lvds_pscript);
					}
					if (entry->type == ENVY_BIOS_DCB_DP) {
						switch (entry->dp_bw) {
							case 0:
								fprintf(out, " BW 162000");
								break;
							case 1:
								fprintf(out, " BW 270000");
								break;
							default:
								fprintf(out, " BW UNK%d", entry->dp_bw);
								break;
						}
						fprintf(out, " lanes");
						for (j = 0; j < 4; j++)
							if (entry->dp_lanes & 1 << j)
								fprintf(out, " %d", j);
					}
					if (entry->unk04)
						fprintf(out, " unk04 0x%02x", entry->unk04);
					if (entry->unk05)
						fprintf(out, " unk05 0x%02x", entry->unk05);
					if (entry->unk06)
						fprintf(out, " unk06 0x%02x", entry->unk06);
					if (entry->unk07)
						fprintf(out, " unk07 0x%02x", entry->unk07);
				}
			} else {
				/* XXX */
			}
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, dcb->rlen, mask);
	}
	fprintf(out, "\n");
	if (bios->dev_rec_offset) {
		fprintf(out, "DEV_REC at 0x%04x\n", bios->dev_rec_offset);
		envy_bios_dump_hex(bios, out, bios->dev_rec_offset, 7, mask);
		fprintf(out, "\n");
	}
	if (dcb->rdcb_valid) {
		fprintf(out, "RDCB table at 0x%04x version %d.%d", dcb->offset, dcb->rdcb_version >> 4, dcb->rdcb_version & 0xf);
		if (dcb->tvdac0_present) {
			fprintf(out, " TVDAC0 line %d", dcb->tvdac0_line);
			if (dcb->tvdac0_neg)
				fprintf(out, " NEG");
		}
		if (dcb->rdcb_unk04_0)
			fprintf(out, " unk04_0 %d", dcb->rdcb_unk04_0);
		if (dcb->rdcb_unk05_2)
			fprintf(out, " unk05_2 %d", dcb->rdcb_unk05_2);
		int j;
		for (j = 0; j < 7; j++) {
			if (dcb->rdcb_unk06[j])
				fprintf(out, " unk0x%02x 0x%02x", j+6, dcb->rdcb_unk06[j]);
		}
		if (dcb->rdcb_unk0d)
			fprintf(out, " unk0d 0x%02x", dcb->rdcb_unk0d);
		for (j = 0; j < 13; j++) {
			if (dcb->rdcb_unk10[j])
				fprintf(out, " unk0x%02x 0x%02x", j+0x10, dcb->rdcb_unk10[j]);
		}
		fprintf(out, "\n");
		envy_bios_dump_hex(bios, out, dcb->offset - dcb->rdcb_len, dcb->rdcb_len, mask);
		fprintf(out, "\n");
	}
}